

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O2

size_t __thiscall
raspicam::_private::Private_Impl::getImageTypeSize(Private_Impl *this,RASPICAM_FORMAT type)

{
  int iVar1;
  uint uVar2;
  
  if (type - RASPICAM_FORMAT_BGR < 2) {
    uVar2 = (this->State).width * (this->State).height * 3;
  }
  else if (type == RASPICAM_FORMAT_GRAY) {
    uVar2 = (this->State).height * (this->State).width;
  }
  else {
    uVar2 = 0;
    if (type == RASPICAM_FORMAT_YUV420) {
      uVar2 = (this->State).width;
      iVar1 = (this->State).height;
      uVar2 = ((uVar2 >> 1) * iVar1 & 0xfffffffe) + iVar1 * uVar2;
    }
  }
  return (ulong)uVar2;
}

Assistant:

size_t Private_Impl::getImageTypeSize ( RASPICAM_FORMAT type ) const{
            switch ( type ) {
            case RASPICAM_FORMAT_YUV420:
                return getWidth() *getHeight() + 2* ( ( getWidth() /2 *getHeight() /2 ) );
                break;
            case RASPICAM_FORMAT_GRAY:
                return getWidth() *getHeight();
                break;
            case RASPICAM_FORMAT_BGR:
            case RASPICAM_FORMAT_RGB:
                return 3*getWidth() *getHeight();
                break;
            default:
                return 0;
            };
        }